

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argparse::Argument::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Argument *this)

{
  bool bVar1;
  const_reference __any;
  logic_error *this_00;
  const_reference __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Argument *local_18;
  Argument *this_local;
  
  local_18 = this;
  this_local = (Argument *)__return_storage_ptr__;
  bVar1 = std::vector<std::any,_std::allocator<std::any>_>::empty(&this->m_values);
  if (bVar1) {
    bVar1 = std::any::has_value(&this->m_default_value);
    if (!bVar1) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::back(&this->m_names);
      std::operator+(&local_58,"No value provided for \'",__rhs);
      std::operator+(&local_38,&local_58,"\'.");
      std::logic_error::logic_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::any_cast<std::__cxx11::string>(__return_storage_ptr__,&this->m_default_value);
  }
  else {
    __any = std::vector<std::any,_std::allocator<std::any>_>::front(&this->m_values);
    std::any_cast<std::__cxx11::string>(__return_storage_ptr__,__any);
  }
  return __return_storage_ptr__;
}

Assistant:

T get() const {
    if (!m_values.empty()) {
      if constexpr (details::IsContainer<T>) {
        return any_cast_container<T>(m_values);
      } else {
        return std::any_cast<T>(m_values.front());
      }
    }
    if (m_default_value.has_value()) {
      return std::any_cast<T>(m_default_value);
    }
    if constexpr (details::IsContainer<T>) {
      if (!m_accepts_optional_like_value) {
        return any_cast_container<T>(m_values);
      }
    }

    throw std::logic_error("No value provided for '" + m_names.back() + "'.");
  }